

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O3

avl_node * avl_find_lessequal(avl_tree *tree,void *key)

{
  _func_int_void_ptr_void_ptr *p_Var1;
  int iVar2;
  avl_node *paVar3;
  avl_node *paVar4;
  
  if (tree->root == (avl_node *)0x0) {
    paVar4 = (avl_node *)0x0;
  }
  else {
    p_Var1 = tree->comp;
    paVar4 = tree->root;
    do {
      while( true ) {
        paVar3 = paVar4;
        iVar2 = (*p_Var1)(key,paVar3->key);
        if (iVar2 < 0) break;
        if ((iVar2 == 0) || (paVar4 = paVar3->right, paVar3->right == (avl_node *)0x0))
        goto LAB_001405d7;
      }
      paVar4 = paVar3->left;
    } while (paVar3->left != (avl_node *)0x0);
    do {
      if ((avl_node *)(tree->list_head).next == paVar3) {
        return (avl_node *)0x0;
      }
      paVar3 = (avl_node *)(paVar3->list).prev;
      iVar2 = (*tree->comp)(key,paVar3->key);
    } while (iVar2 < 0);
LAB_001405d7:
    do {
      paVar4 = paVar3;
      if ((avl_node *)(tree->list_head).prev == paVar4) {
        return paVar4;
      }
      paVar3 = (avl_node *)(paVar4->list).next;
      iVar2 = (*tree->comp)(key,paVar3->key);
    } while (-1 < iVar2);
  }
  return paVar4;
}

Assistant:

struct avl_node *
avl_find_lessequal(const struct avl_tree *tree, const void *key) {
  struct avl_node *node, *next;
  int diff;

  if (tree->root == NULL)
    return NULL;

  node = _avl_find_rec(tree->root, key, tree->comp, &diff);

  /* go left as long as key<node.key */
  while (diff < 0) {
    if (list_is_first(&tree->list_head, &node->list)) {
      return NULL;
    }

    node = (struct avl_node *)node->list.prev;
    diff = (*tree->comp)(key, node->key);
  }

  /* go right as long as key>=next_node.key */
  next = node;
  while (diff >= 0) {
    node = next;
    if (list_is_last(&tree->list_head, &node->list)) {
      break;
    }

    next = (struct avl_node *)node->list.next;
    diff = (*tree->comp)(key, next->key);
  }
  return node;
}